

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferTestInstance *this)

{
  void *pvVar1;
  VkDeviceSize VVar2;
  undefined8 uVar3;
  BufferTestInstance *this_00;
  VkResult VVar4;
  int iVar5;
  InstanceInterface *pIVar6;
  VkPhysicalDevice pVVar7;
  VkDevice device;
  SparseContext *pSVar8;
  VkQueue pVVar9;
  ostream *poVar10;
  DeviceDriver *vk;
  long lVar11;
  NotSupportedError *this_01;
  ulong uVar12;
  char **value;
  uint uVar13;
  VkPhysicalDeviceProperties *__return_storage_ptr___00;
  VkPhysicalDeviceProperties *__return_storage_ptr___01;
  ulong local_7f0;
  VkMemoryAllocateInfo memAlloc;
  deUint32 queueFamilyIndex;
  undefined1 local_7b8 [8];
  DeviceInterface *pDStack_7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_798;
  BufferTestInstance *local_770;
  VkMemoryRequirements memReqs;
  VkBufferCreateInfo bufferParams;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkDeviceMemory rawMemory;
  VkBuffer rawBuffer;
  VkSparseBufferMemoryBindInfo sparseBufferMemoryBindInfo;
  ulong local_688 [6];
  ostringstream errorMsg;
  ulong local_4f8;
  VkPhysicalDeviceFeatures local_314;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  
  pIVar6 = getInstanceInterface(this);
  pVVar7 = getPhysicalDevice(this);
  ::vk::getPhysicalDeviceFeatures(&local_314,pIVar6,pVVar7);
  uVar13 = (this->m_testCase).flags;
  local_770 = this;
  if (((uVar13 & 1) == 0) || (local_314.sparseBinding != 0)) {
    if (((uVar13 & 2) == 0) || (local_314.sparseResidencyBuffer != 0)) {
      if (((uVar13 & 4) == 0) || (local_314.sparseResidencyAliased != 0)) {
        local_688[0] = 1;
        local_688[1]._0_4_ = 0x49d;
        local_688[1]._4_4_ = 0;
        local_688[2]._0_4_ = 0x3e77;
        local_688[2]._4_4_ = 0;
        local_688[3]._0_4_ = 0x4000;
        local_688[3]._4_4_ = 0;
        local_688[4] = 0xffffffffffffffff;
        lVar11 = 0;
        do {
          this_00 = local_770;
          if (lVar11 == 5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&errorMsg,"Pass",(allocator<char> *)&memoryProperties);
            tcu::TestStatus::pass(__return_storage_ptr__,(string *)&errorMsg);
            std::__cxx11::string::~string((string *)&errorMsg);
            return __return_storage_ptr__;
          }
          local_7f0 = local_688[lVar11];
          pVVar7 = getPhysicalDevice(local_770);
          pIVar6 = getInstanceInterface(this_00);
          pSVar8 = (this_00->m_sparseContext).
                   super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                   .m_data.ptr;
          if (pSVar8 == (SparseContext *)0x0) {
            device = Context::getDevice((this_00->super_TestInstance).m_context);
            pSVar8 = (this_00->m_sparseContext).
                     super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                     .m_data.ptr;
            if (pSVar8 != (SparseContext *)0x0) goto LAB_00479329;
            vk = (DeviceDriver *)
                 Context::getDeviceInterface((this_00->super_TestInstance).m_context);
            pSVar8 = (this_00->m_sparseContext).
                     super_UniqueBase<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::BufferTestInstance::SparseContext>_>
                     .m_data.ptr;
            if (pSVar8 != (SparseContext *)0x0) goto LAB_0047932d;
            queueFamilyIndex =
                 Context::getUniversalQueueFamilyIndex((this_00->super_TestInstance).m_context);
          }
          else {
            device = (pSVar8->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
LAB_00479329:
            vk = &pSVar8->m_deviceInterface;
LAB_0047932d:
            queueFamilyIndex = pSVar8->m_queueFamilyIndex;
          }
          __return_storage_ptr___01 = (VkPhysicalDeviceProperties *)&memAlloc;
          ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,pIVar6,pVVar7);
          ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)&errorMsg,pIVar6,pVVar7);
          local_798.m_data.deleter.m_device = (VkDevice)0x0;
          local_798.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
          local_798.m_data.object.m_internal = 0;
          local_798.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
          memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
          memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          uVar13 = (local_770->m_testCase).flags;
          if (((uVar13 & 1) != 0) && (local_4f8 < local_7f0)) {
            local_7f0 = local_4f8;
          }
          bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
          bufferParams.pNext = (void *)0x0;
          bufferParams.flags = uVar13;
          bufferParams.size = 1;
          bufferParams.usage = (local_770->m_testCase).usage;
          bufferParams.sharingMode = (local_770->m_testCase).sharingMode;
          bufferParams.queueFamilyIndexCount = 1;
          bufferParams.pQueueFamilyIndices = &queueFamilyIndex;
          ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)__return_storage_ptr___01,
                             &vk->super_DeviceInterface,device,&bufferParams,
                             (VkAllocationCallbacks *)0x0);
          uVar3 = memAlloc._24_8_;
          VVar2 = memAlloc.allocationSize;
          pvVar1 = memAlloc.pNext;
          _errorMsg = (pointer)memAlloc._0_8_;
          memAlloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          memAlloc._4_4_ = 0;
          memAlloc.pNext = (void *)0x0;
          memAlloc.allocationSize = 0;
          memAlloc.memoryTypeIndex = 0;
          memAlloc._28_4_ = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset(&local_798);
          local_798.m_data.deleter.m_device = (VkDevice)VVar2;
          local_798.m_data.deleter.m_allocator = (VkAllocationCallbacks *)uVar3;
          local_798.m_data.object.m_internal = (deUint64)_errorMsg;
          local_798.m_data.deleter.m_deviceIface = (DeviceInterface *)pvVar1;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)8>_> *)__return_storage_ptr___01);
          (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xe])
                    (vk,device,local_798.m_data.object.m_internal,&memReqs);
          uVar13 = 0x20;
          if ((memReqs.memoryTypeBits != 0) && (uVar13 = 0, memReqs.memoryTypeBits != 0)) {
            for (; (memReqs.memoryTypeBits >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar12 = -memReqs.alignment &
                   ((memoryProperties.memoryHeaps[memoryProperties.memoryTypes[uVar13].heapIndex].
                     size >> 1) + memReqs.alignment) - 1;
          if (local_7f0 <= uVar12) {
            uVar12 = local_7f0;
          }
          do {
            while( true ) {
              local_7f0 = uVar12;
              if (memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0
                 ) {
                if (((local_770->m_testCase).flags & 7) == 0) {
                  iVar5 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                                    (vk,device,local_798.m_data.object.m_internal);
                  if (iVar5 != 0) {
                    de::toString<unsigned_long>((string *)__return_storage_ptr___01,&local_7f0);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bufferParams,
                                   "Bind buffer memory failed! (requested memory size: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__return_storage_ptr___01);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&errorMsg,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bufferParams,")");
                    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&errorMsg);
                    std::__cxx11::string::~string((string *)&errorMsg);
                    std::__cxx11::string::~string((string *)&bufferParams);
                    goto LAB_00479b8c;
                  }
                }
                else {
                  pVVar9 = ::vk::getDeviceQueue
                                     (&vk->super_DeviceInterface,device,queueFamilyIndex,0);
                  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                  bufferParams._4_4_ = 0;
                  bufferParams.pNext = (void *)memReqs.size;
                  bufferParams._16_8_ =
                       memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
                  ;
                  bufferParams.size = 0;
                  bufferParams.usage = 0;
                  _errorMsg = (pointer)0x7;
                  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_7b8,
                                    &vk->super_DeviceInterface,device,0,(VkAllocationCallbacks *)0x0
                                   );
                  memAlloc.allocationSize = local_7a8._M_allocated_capacity;
                  memAlloc._24_8_ = local_7a8._8_8_;
                  memAlloc._0_8_ = local_7b8;
                  memAlloc.pNext = pDStack_7b0;
                  local_7b8 = (undefined1  [8])0x0;
                  pDStack_7b0 = (DeviceInterface *)0x0;
                  local_7a8._M_allocated_capacity = 0;
                  local_7a8._8_8_ = (VkAllocationCallbacks *)0x0;
                  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_7b8);
                  iVar5 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                                    (vk,pVVar9,1,(VkPhysicalDeviceProperties *)&errorMsg);
                  if (iVar5 == 0) {
                    VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                                      (vk,device,1,__return_storage_ptr___01,1,0xffffffffffffffff);
                    ::vk::checkResult(VVar4,
                                      "vk.waitForFences(vkDevice, 1, &fence.get(), VK_TRUE, ~(0ull) )"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                                      ,0x15d);
                  }
                  else {
                    de::toString<unsigned_long>((string *)&rawMemory,&local_7f0);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&rawBuffer,
                                   "Bind sparse buffer memory failed! (requested memory size: ",
                                   (string *)&rawMemory);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_7b8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&rawBuffer,")");
                    tcu::TestStatus::fail
                              (__return_storage_ptr__,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_7b8);
                    std::__cxx11::string::~string((string *)local_7b8);
                    std::__cxx11::string::~string((string *)&rawBuffer);
                    std::__cxx11::string::~string((string *)&rawMemory);
                  }
                  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)__return_storage_ptr___01);
                  if (iVar5 != 0) goto LAB_00479b91;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&errorMsg,"Pass",(allocator<char> *)&bufferParams);
                tcu::TestStatus::pass(__return_storage_ptr__,(string *)&errorMsg);
                __return_storage_ptr___01 = (VkPhysicalDeviceProperties *)&errorMsg;
                goto LAB_00479b8c;
              }
              rawBuffer.m_internal = 0;
              bufferParams.size = local_7f0;
              _errorMsg = (pointer)0x0;
              ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset(&local_798);
              local_798.m_data.deleter.m_device = (VkDevice)0x0;
              local_798.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
              local_798.m_data.object.m_internal = 0;
              local_798.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
              ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&errorMsg);
              VVar4 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x21])
                                (vk,device,&bufferParams,0);
              if (VVar4 != VK_SUCCESS) break;
              _errorMsg = (pointer)::vk::refdetails::check<vk::Handle<(vk::HandleType)8>>
                                             ((Handle<(vk::HandleType)8>)rawBuffer.m_internal);
              memAlloc.allocationSize = 0;
              memAlloc.memoryTypeIndex = 0;
              memAlloc._28_4_ = 0;
              memAlloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              memAlloc._4_4_ = 0;
              memAlloc.pNext = (void *)0x0;
              ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset(&local_798);
              local_798.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
              local_798.m_data.object.m_internal = (deUint64)_errorMsg;
              local_798.m_data.deleter.m_deviceIface = &vk->super_DeviceInterface;
              local_798.m_data.deleter.m_device = device;
              ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)__return_storage_ptr___01);
              (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xe])
                        (vk,device,local_798.m_data.object.m_internal,&memReqs);
              if (memReqs.size < local_7f0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
                poVar10 = std::operator<<((ostream *)&errorMsg,"Requied memory size (");
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                poVar10 = std::operator<<(poVar10," bytes) smaller than the buffer\'s size (");
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::operator<<(poVar10," bytes)!");
                std::__cxx11::stringbuf::str();
                tcu::TestStatus::fail(__return_storage_ptr__,(string *)__return_storage_ptr___01);
                std::__cxx11::string::~string((string *)__return_storage_ptr___01);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
                goto LAB_00479b91;
              }
              rawMemory.m_internal = 0;
              memAlloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
              memAlloc.pNext = (void *)0x0;
              memAlloc.allocationSize = memReqs.size;
              memAlloc.memoryTypeIndex = uVar13;
              iVar5 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[5])
                                (vk,device,__return_storage_ptr___01,0);
              if (iVar5 == 0) {
                _errorMsg = (pointer)::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                                               ((Handle<(vk::HandleType)7>)rawMemory.m_internal);
                local_7a8._M_allocated_capacity = 0;
                local_7a8._8_8_ = (VkAllocationCallbacks *)0x0;
                local_7b8 = (undefined1  [8])0x0;
                pDStack_7b0 = (DeviceInterface *)0x0;
                ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
                          (&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
                memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
                     (VkAllocationCallbacks *)0x0;
                memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
                     (deUint64)_errorMsg;
                memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                     &vk->super_DeviceInterface;
                memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                     device;
                ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
                          ((RefBase<vk::Handle<(vk::HandleType)7>_> *)local_7b8);
                uVar12 = local_7f0;
              }
              else {
                local_7f0 = -memReqs.alignment & ((local_7f0 >> 4) + memReqs.alignment) - 1;
                if ((local_7f0 == 0) || (uVar12 = local_7f0, memReqs.size == memReqs.alignment)) {
                  __return_storage_ptr___00 = (VkPhysicalDeviceProperties *)&rawBuffer;
                  de::toString<unsigned_long>((string *)__return_storage_ptr___00,&memReqs.size);
                  __return_storage_ptr___01 = (VkPhysicalDeviceProperties *)local_7b8;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr___01,"Unable to allocate ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr___00);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&errorMsg,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__return_storage_ptr___01," bytes of memory");
                  tcu::TestStatus::fail(__return_storage_ptr__,(string *)&errorMsg);
                  std::__cxx11::string::~string((string *)&errorMsg);
                  goto LAB_00479b84;
                }
              }
            }
            local_7f0 = -memReqs.alignment & ((local_7f0 >> 4) + memReqs.alignment) - 1;
          } while ((local_7f0 != 0) && (uVar12 = local_7f0, bufferParams.size != memReqs.alignment))
          ;
          rawMemory.m_internal = (deUint64)::vk::getResultName(VVar4);
          __return_storage_ptr___00 = (VkPhysicalDeviceProperties *)local_7b8;
          de::toString<char_const*>((string *)__return_storage_ptr___00,(de *)&rawMemory,value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr___01,"Buffer creation failed! (",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr___00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &errorMsg,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr___01,")");
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&errorMsg);
          std::__cxx11::string::~string((string *)&errorMsg);
LAB_00479b84:
          std::__cxx11::string::~string((string *)__return_storage_ptr___01);
          __return_storage_ptr___01 = __return_storage_ptr___00;
LAB_00479b8c:
          std::__cxx11::string::~string((string *)__return_storage_ptr___01);
LAB_00479b91:
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
                    (&memory.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_798);
          if (__return_storage_ptr__->m_code != QP_TEST_RESULT_PASS) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_description);
          lVar11 = lVar11 + 1;
        } while( true );
      }
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Sparse aliased residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x173);
    }
    else {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Sparse buffer residency feature is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
                 ,0x170);
    }
  }
  else {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Sparse bindings feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x16d);
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus BufferTestInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&	physicalDeviceFeatures	= getPhysicalDeviceFeatures(getInstanceInterface(), getPhysicalDevice());

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT ) && !physicalDeviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse bindings feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT ) && !physicalDeviceFeatures.sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse buffer residency feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_ALIASED_BIT ) && !physicalDeviceFeatures.sparseResidencyAliased)
		TCU_THROW(NotSupportedError, "Sparse aliased residency feature is not supported");

	const VkDeviceSize testSizes[] =
	{
		1,
		1181,
		15991,
		16384,
		~0ull,		// try to exercise a very large buffer too (will be clamped to a sensible size later)
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(testSizes); ++i)
	{
		const tcu::TestStatus testStatus = bufferCreateAndAllocTest(testSizes[i]);

		if (testStatus.getCode() != QP_TEST_RESULT_PASS)
			return testStatus;
	}

	return tcu::TestStatus::pass("Pass");
}